

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlloader.c
# Opt level: O1

void CMdlclose(void *vdlh)

{
  free(*(void **)((long)vdlh + 8));
  free(vdlh);
  return;
}

Assistant:

void
CMdlclose(void *vdlh)
{
#if NO_DYNAMIC_LINKING
    return;
#else
    dlhandle dlh = (dlhandle)vdlh;
#ifdef ACTUALL_DO_DLCLOSE
    dlclose(dlh->dlopen_handle);
#endif
    free(dlh->lib_prefix);
    free(dlh);
#endif
}